

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_split_conic(PVG_FT_Vector *base)

{
  long lVar1;
  long lVar2;
  TPos b;
  TPos a;
  PVG_FT_Vector *base_local;
  
  base[4].x = base[2].x;
  lVar1 = (base[2].x + base[1].x) / 2;
  base[3].x = lVar1;
  lVar2 = (base->x + base[1].x) / 2;
  base[1].x = lVar2;
  base[2].x = (lVar1 + lVar2) / 2;
  base[4].y = base[2].y;
  lVar1 = (base[2].y + base[1].y) / 2;
  base[3].y = lVar1;
  lVar2 = (base->y + base[1].y) / 2;
  base[1].y = lVar2;
  base[2].y = (lVar1 + lVar2) / 2;
  return;
}

Assistant:

static void
  gray_split_conic( PVG_FT_Vector*  base )
  {
    TPos  a, b;


    base[4].x = base[2].x;
    b = base[1].x;
    a = base[3].x = ( base[2].x + b ) / 2;
    b = base[1].x = ( base[0].x + b ) / 2;
    base[2].x = ( a + b ) / 2;

    base[4].y = base[2].y;
    b = base[1].y;
    a = base[3].y = ( base[2].y + b ) / 2;
    b = base[1].y = ( base[0].y + b ) / 2;
    base[2].y = ( a + b ) / 2;
  }